

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O0

int __thiscall xmrig::Controller::init(Controller *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  Config *pCVar2;
  VirtualMemory *this_00;
  CpuConfig *this_01;
  Network *pNVar3;
  Controller *in_stack_00000028;
  Network *in_stack_00000030;
  CpuConfig *in_stack_ffffffffffffffd0;
  
  Base::init(&this->super_Base,ctx);
  pCVar2 = Base::config(&this->super_Base);
  Config::cpu(pCVar2);
  this_00 = (VirtualMemory *)CpuConfig::memPoolSize(in_stack_ffffffffffffffd0);
  pCVar2 = Base::config(&this->super_Base);
  this_01 = Config::cpu(pCVar2);
  bVar1 = CpuConfig::isHugePages(this_01);
  VirtualMemory::init(this_00,(EVP_PKEY_CTX *)(ulong)bVar1);
  pNVar3 = (Network *)operator_new(0x218);
  Network::Network(in_stack_00000030,in_stack_00000028);
  this->m_network = pNVar3;
  return 0;
}

Assistant:

int xmrig::Controller::init()
{
    Base::init();

    VirtualMemory::init(config()->cpu().memPoolSize(), config()->cpu().isHugePages());

    m_network = new Network(this);

    return 0;
}